

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

string * __thiscall
slang::ConstantValue::toString_abi_cxx11_
          (ConstantValue *this,bitwidth_t abbreviateThresholdBits,bool exactUnknowns,
          bool useAssignmentPatterns)

{
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *in_RSI;
  string *in_RDI;
  
  std::
  visit<slang::ConstantValue::toString[abi:cxx11](unsigned_int,bool,bool)const::__0,std::variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>const&>
            ((anon_class_8_3_a073b316 *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string ConstantValue::toString(bitwidth_t abbreviateThresholdBits, bool exactUnknowns,
                                    bool useAssignmentPatterns) const {
    return std::visit(
        [abbreviateThresholdBits, exactUnknowns, useAssignmentPatterns](auto&& arg) {
            using T = std::decay_t<decltype(arg)>;
            if constexpr (std::is_same_v<T, std::monostate>)
                return "<unset>"s;
            else if constexpr (std::is_same_v<T, SVInt>)
                return arg.toString(abbreviateThresholdBits, exactUnknowns);
            else if constexpr (std::is_same_v<T, real_t>)
                return fmt::format("{}", double(arg));
            else if constexpr (std::is_same_v<T, shortreal_t>)
                return fmt::format("{}", float(arg));
            else if constexpr (std::is_same_v<T, ConstantValue::NullPlaceholder>)
                return "null"s;
            else if constexpr (std::is_same_v<T, ConstantValue::UnboundedPlaceholder>)
                return "$"s;
            else if constexpr (std::is_same_v<T, Elements>) {
                FormatBuffer buffer;
                buffer.append(useAssignmentPatterns ? "'{"sv : "["sv);
                for (auto& element : arg) {
                    buffer.append(element.toString(abbreviateThresholdBits, exactUnknowns,
                                                   useAssignmentPatterns));
                    buffer.append(",");
                }

                if (!arg.empty())
                    buffer.pop_back();
                buffer.append(useAssignmentPatterns ? "}"sv : "]"sv);
                return buffer.str();
            }
            else if constexpr (std::is_same_v<T, std::string>)
                return fmt::format("\"{}\"", arg);
            else if constexpr (std::is_same_v<T, Map>) {
                FormatBuffer buffer;
                buffer.append(useAssignmentPatterns ? "'{"sv : "["sv);
                for (auto& [key, val] : *arg)
                    buffer.format("{}:{},",
                                  key.toString(abbreviateThresholdBits, exactUnknowns,
                                               useAssignmentPatterns),
                                  val.toString(abbreviateThresholdBits, exactUnknowns,
                                               useAssignmentPatterns));

                if (arg->defaultValue)
                    buffer.format("default:{}",
                                  arg->defaultValue.toString(abbreviateThresholdBits, exactUnknowns,
                                                             useAssignmentPatterns));
                else if (!arg->empty())
                    buffer.pop_back();

                buffer.append(useAssignmentPatterns ? "}"sv : "]"sv);
                return buffer.str();
            }
            else if constexpr (std::is_same_v<T, Queue>) {
                FormatBuffer buffer;
                buffer.append(useAssignmentPatterns ? "'{"sv : "["sv);
                for (auto& element : *arg) {
                    buffer.append(element.toString(abbreviateThresholdBits, exactUnknowns,
                                                   useAssignmentPatterns));
                    buffer.append(",");
                }

                if (!arg->empty())
                    buffer.pop_back();
                buffer.append(useAssignmentPatterns ? "}"sv : "]"sv);
                return buffer.str();
            }
            else if constexpr (std::is_same_v<T, Union>) {
                if (!arg->activeMember)
                    return "(unset)"s;

                return fmt::format("({}) {}", *arg->activeMember,
                                   arg->value.toString(abbreviateThresholdBits, exactUnknowns,
                                                       useAssignmentPatterns));
            }
            else {
                static_assert(always_false<T>::value, "Missing case");
            }
        },
        value);
}